

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

uint32_t lys_module_pos(lys_module *module)

{
  uint32_t local_20;
  int local_1c;
  uint32_t pos;
  int i;
  lys_module *module_local;
  
  local_20 = 1;
  local_1c = 0;
  while( true ) {
    if ((module->ctx->models).used <= local_1c) {
      ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
             ,0x12d1);
      return 0;
    }
    if ((module->ctx->models).list[local_1c] == module) break;
    local_20 = local_20 + 1;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

static uint32_t
lys_module_pos(struct lys_module *module)
{
    int i;
    uint32_t pos = 1;

    for (i = 0; i < module->ctx->models.used; ++i) {
        if (module->ctx->models.list[i] == module) {
            return pos;
        }
        ++pos;
    }

    LOGINT(module->ctx);
    return 0;
}